

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

shared_ptr<SchemePort>
get_output_port(list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                *l,string *proc,size_t skip)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *extraout_RAX;
  runtime_error *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _List_node_base *p_Var5;
  SchemePort *__tmp;
  element_type *peVar6;
  pointer pcVar7;
  __shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2> _Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  element_type *peVar3;
  
  _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  (l->
  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>).
  _M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var2 = current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  (l->
  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>).
  _M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)
       current_output_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  _Var1._M_refcount._M_pi = _Var4._M_pi;
  _Var1._M_ptr = (element_type *)_Var2._M_pi;
  _Var8._M_refcount._M_pi = _Var4._M_pi;
  _Var8._M_ptr = (element_type *)_Var2._M_pi;
  if (in_RCX < (proc->field_2)._M_allocated_capacity) {
    pcVar7 = (proc->_M_dataplus)._M_p;
    if ((long)in_RCX < 1) {
      if (in_RCX != 0) {
        do {
          pcVar7 = *(pointer *)(pcVar7 + 8);
          in_RCX = in_RCX + 1;
        } while (in_RCX != 0);
      }
    }
    else {
      do {
        pcVar7 = *(pointer *)pcVar7;
        in_RCX = in_RCX - 1;
      } while (in_RCX != 0);
    }
    if (*(long *)(pcVar7 + 0x10) == 0) {
      p_Var5 = (_List_node_base *)0x0;
      peVar6 = (element_type *)0x0;
    }
    else {
      p_Var5 = (_List_node_base *)0x0;
      _Var8 = (__shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>)
              __dynamic_cast(*(long *)(pcVar7 + 0x10),&SchemeObject::typeinfo,&SchemePort::typeinfo,
                             0);
      peVar3 = _Var8._M_ptr;
      peVar6 = (element_type *)0x0;
      if (peVar3 != (element_type *)0x0) {
        p_Var5 = *(_List_node_base **)(pcVar7 + 0x18);
        peVar6 = peVar3;
        if (p_Var5 == (_List_node_base *)0x0) {
          p_Var5 = (_List_node_base *)0x0;
        }
        else if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var5->_M_prev = *(int *)&p_Var5->_M_prev + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var5->_M_prev = *(int *)&p_Var5->_M_prev + 1;
        }
      }
    }
    (l->
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)peVar6;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (l->
           super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
    (l->
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = p_Var5;
    _Var1 = _Var8;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      _Var1._M_refcount._M_pi = extraout_RDX._M_pi;
      _Var1._M_ptr = extraout_RAX;
    }
  }
  else {
    peVar6 = (element_type *)
             (l->
             super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  }
  if ((peVar6 != (element_type *)0x0) &&
     ((peVar6->output_stream).
      super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0)) {
    return (shared_ptr<SchemePort>)_Var1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)skip
                 ,": bad port");
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_0017a350;
  __cxa_throw(this_00,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::shared_ptr<SchemePort>
get_output_port(const std::list<std::shared_ptr<SchemeObject>> &l, const std::string &proc, size_t skip)
{
    auto port = current_output_port;
    if(l.size() > skip)
        port = std::dynamic_pointer_cast<SchemePort>(*next(l.begin(), skip));
    if(!port || !port->output_stream)
        throw eval_error(proc + ": bad port");
    return port;
}